

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O1

bool_t decLuhnVerify(char *dec)

{
  long lVar1;
  uint uVar2;
  size_t sVar3;
  long lVar4;
  
  sVar3 = strLen(dec);
  if (sVar3 == 0) {
    uVar2 = 1;
  }
  else {
    lVar4 = 0;
    do {
      lVar4 = lVar4 + dec[sVar3 - 1] + -0x30;
      if (sVar3 == 1) {
        sVar3 = 0;
      }
      else {
        lVar1 = sVar3 - 2;
        sVar3 = sVar3 - 2;
        lVar4 = lVar4 + *(long *)(
                                 "bee2cmd/%s: %s\nUsage:\n  ver\n    print version and build information\n"
                                 + (long)dec[lVar1] * 8 + 0x3c);
      }
    } while (sVar3 != 0);
    uVar2 = (uint)(((ulong)(lVar4 * -0x3333333333333333) >> 1 |
                   (ulong)((lVar4 * -0x3333333333333333 & 1U) != 0) << 0x3f) < 0x199999999999999a);
  }
  return uVar2;
}

Assistant:

bool_t decLuhnVerify(const char* dec)
{
	register word cd = 0;
	size_t i;
	ASSERT(decIsValid(dec));
	for (i = strLen(dec); i--;) 
	{
		cd += dec[i] - '0';
		if (i)
			cd += luhn_table[dec[--i] - '0'];
	}
	cd %= 10;
	return wordEq(cd, 0);
}